

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

ssize_t readn(int fd,string *inBuffer)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t sStack_1060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  char buff [4096];
  
  sStack_1060 = 0;
  while( true ) {
    while( true ) {
      sVar1 = read(fd,buff,0x1000);
      if (-1 < sVar1) break;
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        if (*piVar2 != 0xb) {
          perror("read error");
          sStack_1060 = -1;
        }
        return sStack_1060;
      }
    }
    if (sVar1 == 0) break;
    local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1058,buff,buff + sVar1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (inBuffer,&local_1058);
    sStack_1060 = sStack_1060 + sVar1;
    std::__cxx11::string::~string((string *)&local_1058);
  }
  return sStack_1060;
}

Assistant:

ssize_t readn(int fd, std::string &inBuffer){
    ssize_t nread=0;
    ssize_t readSum=0;

    while (true) {
        char buff[MAX_BUFF];
        if ((nread=read(fd, buff, MAX_BUFF))<0) {
            if(errno==EINTR){
                continue;
            }else if (errno==EAGAIN) {
                return readSum;
            }else {
                perror("read error");
                return -1;
            }
        }else if (nread==0) {
            break;
        }
        // printf("before inBuffer.size() = %d\n", inBuffer.size());
        // printf("nread = %d\n", nread);
        readSum+=nread;
        // buff += nread;
        inBuffer+=std::string(buff, buff+nread);
        // printf("after inBuffer.size() = %d\n", inBuffer.size());
    }
    return readSum;
}